

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ConditionalBranchDirectiveSyntax::setChild
          (ConditionalBranchDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar9;
  
  if (index == 2) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar9 = *ppSVar7;
    uVar3 = *(undefined4 *)&pSVar9->field_0x4;
    pSVar1 = pSVar9->parent;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind = pSVar9->kind;
    *(undefined4 *)&(this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar9->previewNode;
    (this->disabledTokens).super_SyntaxListBase.childCount = *(size_t *)(pSVar9 + 1);
    pSVar1 = pSVar9[1].previewNode;
    (this->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar9[1].parent;
    (this->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else if (index == 1) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar9 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar9 = *ppSVar7;
    }
    (this->expr).ptr = (ConditionalDirectiveExpressionSyntax *)pSVar9;
  }
  else {
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar4 = pvVar8->field_0x2;
    NVar5.raw = (pvVar8->numFlags).raw;
    uVar6 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->super_DirectiveSyntax).directive.kind = pvVar8->kind;
    (this->super_DirectiveSyntax).directive.field_0x2 = uVar4;
    (this->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
    (this->super_DirectiveSyntax).directive.rawLen = uVar6;
    (this->super_DirectiveSyntax).directive.info = pIVar2;
  }
  return;
}

Assistant:

void ConditionalBranchDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<ConditionalDirectiveExpressionSyntax>() : nullptr; return;
        case 2: disabledTokens = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}